

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall GlobOpt::MarkArgumentsUsedForBranch(GlobOpt *this,Instr *instr)

{
  bool bVar1;
  ArgSlot AVar2;
  BranchInstr *pBVar3;
  Opnd *pOVar4;
  Opnd *this_00;
  Instr *this_01;
  SymOpnd *pSVar5;
  StackSym *pSVar6;
  JITOutput *this_02;
  uint16 param;
  Opnd *defSym;
  Instr *defInst;
  RegOpnd *regOpnd;
  Opnd *src2;
  Opnd *src1;
  BranchInstr *bInstr;
  Instr *instr_local;
  GlobOpt *this_local;
  
  bVar1 = IR::Instr::IsBranchInstr(instr);
  if (bVar1) {
    pBVar3 = IR::Instr::AsBranchInstr(instr);
    bVar1 = IR::BranchInstr::IsUnconditional(pBVar3);
    if (!bVar1) {
      pBVar3 = IR::Instr::AsBranchInstr(instr);
      pOVar4 = IR::Instr::GetSrc1(&pBVar3->super_Instr);
      this_00 = IR::Instr::GetSrc2(&pBVar3->super_Instr);
      defInst = (Instr *)0x0;
      if ((this_00 == (Opnd *)0x0) &&
         (((instr->m_opcode == BrFalse_A || (instr->m_opcode == BrTrue_A)) &&
          (bVar1 = IR::Opnd::IsRegOpnd(pOVar4), bVar1)))) {
        defInst = (Instr *)IR::Opnd::AsRegOpnd(pOVar4);
      }
      else if (((this_00 == (Opnd *)0x0) || (bVar1 = IR::Opnd::IsConstOpnd(this_00), !bVar1)) ||
              (bVar1 = IR::Opnd::IsRegOpnd(pOVar4), !bVar1)) {
        if (((this_00 != (Opnd *)0x0) && (bVar1 = IR::Opnd::IsRegOpnd(this_00), bVar1)) &&
           (bVar1 = IR::Opnd::IsConstOpnd(pOVar4), bVar1)) {
          defInst = (Instr *)IR::Opnd::AsRegOpnd(this_00);
        }
      }
      else {
        defInst = (Instr *)IR::Opnd::AsRegOpnd(pOVar4);
      }
      if ((defInst != (Instr *)0x0) &&
         (bVar1 = StackSym::IsSingleDef((StackSym *)defInst->m_next), bVar1)) {
        this_01 = StackSym::GetInstrDef((StackSym *)defInst->m_next);
        pOVar4 = IR::Instr::GetSrc1(this_01);
        if ((pOVar4 != (Opnd *)0x0) && (bVar1 = IR::Opnd::IsSymOpnd(pOVar4), bVar1)) {
          pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
          bVar1 = Sym::IsStackSym(pSVar5->m_sym);
          if (bVar1) {
            pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
            pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
            bVar1 = StackSym::IsParamSlotSym(pSVar6);
            if (bVar1) {
              pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
              pSVar6 = Sym::AsStackSym(pSVar5->m_sym);
              AVar2 = StackSym::GetParamSlotNum(pSVar6);
              if (AVar2 < 0xd) {
                this_02 = Func::GetJITOutput(this->func);
                JITOutput::SetArgUsedForBranch(this_02,(uint8)AVar2);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::MarkArgumentsUsedForBranch(IR::Instr * instr)
{
    // If it's a conditional branch instruction and the operand used for branching is one of the arguments
    // to the function, tag the m_argUsedForBranch of the functionBody so that it can be used later for inlining decisions.
    if (instr->IsBranchInstr() && !instr->AsBranchInstr()->IsUnconditional())
    {
        IR::BranchInstr * bInstr = instr->AsBranchInstr();
        IR::Opnd *src1 = bInstr->GetSrc1();
        IR::Opnd *src2 = bInstr->GetSrc2();
        // These are used because we don't want to rely on src1 or src2 to always be the register/constant
        IR::RegOpnd *regOpnd = nullptr;
        if (!src2 && (instr->m_opcode == Js::OpCode::BrFalse_A || instr->m_opcode == Js::OpCode::BrTrue_A) && src1->IsRegOpnd())
        {
            regOpnd = src1->AsRegOpnd();
        }
        // We need to check for (0===arg) and (arg===0); this is especially important since some minifiers
        // change all instances of one to the other.
        else if (src2 && src2->IsConstOpnd() && src1->IsRegOpnd())
        {
            regOpnd = src1->AsRegOpnd();
        }
        else if (src2 && src2->IsRegOpnd() && src1->IsConstOpnd())
        {
            regOpnd = src2->AsRegOpnd();
        }
        if (regOpnd != nullptr)
        {
            if (regOpnd->m_sym->IsSingleDef())
            {
                IR::Instr * defInst = regOpnd->m_sym->GetInstrDef();
                IR::Opnd *defSym = defInst->GetSrc1();
                if (defSym && defSym->IsSymOpnd() && defSym->AsSymOpnd()->m_sym->IsStackSym()
                    && defSym->AsSymOpnd()->m_sym->AsStackSym()->IsParamSlotSym())
                {
                    uint16 param = defSym->AsSymOpnd()->m_sym->AsStackSym()->GetParamSlotNum();

                    // We only support functions with 13 arguments to ensure optimal size of callSiteInfo
                    if (param < Js::Constants::MaximumArgumentCountForConstantArgumentInlining)
                    {
                        this->func->GetJITOutput()->SetArgUsedForBranch((uint8)param);
                    }
                }
            }
        }
    }
}